

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O2

uchar __thiscall RegVmLoweredFunction::GetRegisterForConstant(RegVmLoweredFunction *this)

{
  undefined1 in_AL;
  uchar uVar1;
  undefined7 in_register_00000001;
  uchar result;
  undefined8 uStack_18;
  
  uStack_18 = CONCAT71(in_register_00000001,in_AL);
  uVar1 = GetRegister(this);
  uStack_18._7_1_ = uVar1;
  SmallArray<unsigned_char,_16U>::push_back
            (&this->constantRegisters,(uchar *)((long)&uStack_18 + 7));
  return uStack_18._7_1_;
}

Assistant:

unsigned char RegVmLoweredFunction::GetRegisterForConstant()
{
	unsigned char result = GetRegister();

	constantRegisters.push_back(result);

	return result;
}